

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

string * __thiscall
Vault::Tiny<Vault::TTLDetail,long>::toString_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostringstream ss;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<long>((long)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string toString() const {
    std::ostringstream ss;
    ss << value();
    return ss.str();
  }